

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ShaderSharingTest::createResource(GLES2ShaderSharingTest *this)

{
  GLuint GVar1;
  GLenum GVar2;
  deBool dVar3;
  MessageBuilder *pMVar4;
  TestError *this_00;
  MessageBuilder local_738;
  MessageBuilder local_5b8;
  MessageBuilder local_438;
  MessageBuilder local_2a8;
  GLchar local_128 [8];
  char buffer [256];
  char *pcStack_20;
  GLint status;
  char *fragmentShader;
  char *vertexShader;
  GLES2ShaderSharingTest *this_local;
  
  fragmentShader =
       "attribute mediump vec2 a_pos;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
  ;
  pcStack_20 = "varying mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_FragColor = v_color;\n}\n";
  vertexShader = (char *)this;
  GVar1 = (*(this->super_GLES2SharingTest).m_gl.createShader)(this->m_shaderType);
  this->m_shader = GVar1;
  GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar2,"glCreateShader()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x338);
  if (this->m_shaderType == 0x8b30) {
    do {
      (*(this->super_GLES2SharingTest).m_gl.shaderSource)
                (this->m_shader,1,&stack0xffffffffffffffe0,(GLint *)0x0);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"shaderSource(m_shader, 1, &fragmentShader, DE_NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x341);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
  }
  else if (this->m_shaderType == 0x8b31) {
    do {
      (*(this->super_GLES2SharingTest).m_gl.shaderSource)
                (this->m_shader,1,&fragmentShader,(GLint *)0x0);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"shaderSource(m_shader, 1, &vertexShader, DE_NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x33d);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
  }
  do {
    (*(this->super_GLES2SharingTest).m_gl.compileShader)(this->m_shader);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"compileShader(m_shader)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x348);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  buffer[0xfc] = '\0';
  buffer[0xfd] = '\0';
  buffer[0xfe] = '\0';
  buffer[0xff] = '\0';
  do {
    (*(this->super_GLES2SharingTest).m_gl.getShaderiv)
              (this->m_shader,0x8b81,(GLint *)(buffer + 0xfc));
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"getShaderiv(m_shader, GL_COMPILE_STATUS, &status)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x34b);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  if (buffer._252_4_ != 0) {
    return;
  }
  do {
    (*(this->super_GLES2SharingTest).m_gl.getShaderInfoLog)
              (this->m_shader,0x100,(GLsizei *)0x0,local_128);
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"getShaderInfoLog(m_shader, 256, DE_NULL, buffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x350);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::TestLog::operator<<
            (&local_2a8,(this->super_GLES2SharingTest).m_log,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_2a8,(char (*) [25])"Failed to compile shader");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2a8);
  if (this->m_shaderType == 0x8b30) {
    tcu::TestLog::operator<<
              (&local_5b8,(this->super_GLES2SharingTest).m_log,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_5b8,&stack0xffffffffffffffe0);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_5b8);
  }
  else if (this->m_shaderType == 0x8b31) {
    tcu::TestLog::operator<<
              (&local_438,(this->super_GLES2SharingTest).m_log,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_438,&fragmentShader);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_438);
  }
  tcu::TestLog::operator<<
            (&local_738,(this->super_GLES2SharingTest).m_log,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_738,(char (*) [256])local_128);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_738);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Failed to compile shader",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
             ,0x363);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void GLES2ShaderSharingTest::createResource (void)
{
	const char* vertexShader = ""
	"attribute mediump vec2 a_pos;\n"
	"attribute mediump vec4 a_color;\n"
	"varying mediump vec4 v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tv_color = a_color;\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}\n";

	const char* fragmentShader = ""
	"varying mediump vec4 v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_FragColor = v_color;\n"
	"}\n";


	m_shader = m_gl.createShader(m_shaderType);
	GLU_CHECK_GLW_MSG(m_gl, "glCreateShader()");

	switch (m_shaderType)
	{
		case GL_VERTEX_SHADER:
			GLU_CHECK_GLW_CALL(m_gl, shaderSource(m_shader, 1, &vertexShader, DE_NULL));
			break;

		case GL_FRAGMENT_SHADER:
			GLU_CHECK_GLW_CALL(m_gl, shaderSource(m_shader, 1, &fragmentShader, DE_NULL));
			break;

		default:
			DE_ASSERT(false);
	}

	GLU_CHECK_GLW_CALL(m_gl, compileShader(m_shader));

	GLint status = 0;
	GLU_CHECK_GLW_CALL(m_gl, getShaderiv(m_shader, GL_COMPILE_STATUS, &status));

	if (!status)
	{
		char buffer[256];
		GLU_CHECK_GLW_CALL(m_gl, getShaderInfoLog(m_shader, 256, DE_NULL, buffer));

		m_log << tcu::TestLog::Message << "Failed to compile shader" << tcu::TestLog::EndMessage;

		switch (m_shaderType)
		{
			case GL_VERTEX_SHADER:
				m_log << tcu::TestLog::Message << vertexShader << tcu::TestLog::EndMessage;
				break;

			case GL_FRAGMENT_SHADER:
				m_log << tcu::TestLog::Message << fragmentShader << tcu::TestLog::EndMessage;
				break;

			default:
				DE_ASSERT(false);
		}

		m_log << tcu::TestLog::Message << buffer << tcu::TestLog::EndMessage;
		TCU_FAIL("Failed to compile shader");
	}
}